

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O2

void __thiscall
vector_block<unsigned_char_*,_1024U>::~vector_block(vector_block<unsigned_char_*,_1024U> *this)

{
  pointer pppuVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0;
      pppuVar1 = (this->_index_block).
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->_index_block).
                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pppuVar1 >> 3);
      uVar2 = uVar2 + 1) {
    free(pppuVar1[uVar2]);
  }
  std::_Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>::~_Vector_base
            ((_Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)this);
  return;
}

Assistant:

~vector_block()
	{
		for (size_t i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
	}